

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

Expr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *this)

{
  char code;
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_01;
  int opcode;
  Expr EVar2;
  LogicalExpr condition;
  Expr then_expr;
  Expr else_expr;
  NumericExpr NVar3;
  StringRef value;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  code = *pcVar1;
  if (code == 'o') {
    opcode = ReadOpCode(this);
    if (opcode == 0x41) {
      condition = ReadLogicalExpr(this);
      then_expr = ReadSymbolicExpr(this);
      else_expr = ReadSymbolicExpr(this);
      EVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnSymbolicIf
                        (this->handler_,(LogicalExpr)condition.super_ExprBase.impl_,
                         (Expr)then_expr.super_ExprBase.impl_,(Expr)else_expr.super_ExprBase.impl_);
      return (Expr)EVar2.super_ExprBase.impl_;
    }
    NVar3 = ReadNumericExpr(this,opcode);
    return (Expr)NVar3.super_ExprBase.impl_;
  }
  if (code == 'h') {
    this_01 = this->handler_;
    value = TextReader<fmt::Locale>::ReadString(this_00);
    EVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnString
                      (this_01,value);
    return (Expr)EVar2.super_ExprBase.impl_;
  }
  NVar3 = ReadNumericExpr(this,code,false);
  return (Expr)NVar3.super_ExprBase.impl_;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}